

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_fma_functor::unary_op_atan>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  long *in_RDI;
  float fVar49;
  undefined1 auVar50 [32];
  undefined1 in_ZMM3 [64];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_atan op;
  Mat *m;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_1;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_1;
  undefined1 local_1850 [16];
  undefined1 local_1840 [32];
  int local_181c;
  undefined8 local_1818;
  undefined8 local_1810;
  undefined8 local_1808;
  undefined4 local_1800;
  long local_17f8;
  undefined4 local_17f0;
  undefined4 local_17ec;
  undefined4 local_17e8;
  undefined4 local_17e4;
  undefined4 local_17e0;
  undefined8 local_17d8;
  undefined1 (*local_17d0) [32];
  int local_17c8;
  int local_17c4;
  int local_17c0;
  int local_17bc;
  int local_17b8;
  int local_17b4;
  int local_17b0;
  undefined1 local_17a9 [9];
  long *local_17a0;
  undefined1 local_1795;
  int local_1794;
  undefined8 *local_1788;
  undefined8 *local_1780;
  undefined8 *local_1770;
  undefined1 (*local_1768) [32];
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined1 (*local_1730) [32];
  undefined1 (*local_1728) [32];
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined1 (*local_1710) [32];
  long local_1708;
  undefined4 local_16fc;
  long local_16f8;
  undefined1 (*local_16f0) [32];
  undefined4 local_16e4;
  int local_16e0;
  int local_16dc;
  undefined8 *local_16d8;
  undefined4 local_16cc;
  long local_16c8;
  undefined8 *local_16b8;
  undefined1 *local_1690;
  undefined1 *local_1688;
  undefined1 *local_1680;
  undefined1 *local_1678;
  undefined1 (*local_1670) [32];
  undefined1 *local_1668;
  undefined1 local_1660 [32];
  undefined1 local_1640 [32];
  undefined1 local_1620 [32];
  undefined1 local_1600 [32];
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [8];
  float fStack_1578;
  float fStack_1574;
  float local_1560;
  float fStack_155c;
  float fStack_1558;
  float fStack_1554;
  float fStack_1550;
  float fStack_154c;
  float fStack_1548;
  undefined4 uStack_1544;
  float local_1540;
  float fStack_153c;
  float fStack_1538;
  float fStack_1534;
  float fStack_1530;
  float fStack_152c;
  float fStack_1528;
  undefined4 uStack_1524;
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  undefined4 uStack_11b0;
  undefined4 uStack_11ac;
  undefined4 uStack_11a8;
  undefined4 uStack_11a4;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined1 *local_1120;
  undefined1 *local_1118;
  float *local_1110;
  undefined8 *local_1108;
  undefined1 *local_1100;
  float *local_10f8;
  undefined8 *local_10f0;
  undefined1 *local_10e8;
  float *local_10e0;
  undefined8 *local_10d8;
  undefined1 *local_10d0;
  float *local_10c8;
  undefined8 *local_10c0;
  undefined8 *local_10b8;
  float *local_10b0;
  undefined8 *local_10a8;
  undefined1 *local_10a0;
  float *local_1098;
  undefined8 *local_1090;
  undefined1 *local_1088;
  float *local_1080;
  undefined8 *local_1078;
  undefined8 *local_1070;
  float *local_1068;
  undefined1 local_1060 [8];
  float fStack_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float fStack_1048;
  float fStack_1044;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  undefined4 uStack_1024;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 local_c40 [32];
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined4 local_b94;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  undefined4 local_b74;
  undefined4 local_b70;
  undefined4 local_b6c;
  undefined4 local_b68;
  undefined4 local_b64;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined4 local_b00;
  undefined4 local_afc;
  undefined4 local_af8;
  undefined4 local_af4;
  undefined4 local_af0;
  undefined4 local_aec;
  undefined4 local_ae8;
  undefined4 local_ae4;
  undefined1 local_ae0 [16];
  undefined1 auStack_ad0 [16];
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined4 local_ab4;
  undefined4 local_ab0;
  undefined4 local_aac;
  undefined4 local_aa8;
  undefined4 local_aa4;
  undefined1 local_aa0 [16];
  undefined1 auStack_a90 [16];
  undefined4 local_a80;
  undefined4 local_a7c;
  undefined4 local_a78;
  undefined4 local_a74;
  undefined4 local_a70;
  undefined4 local_a6c;
  undefined4 local_a68;
  undefined4 local_a64;
  undefined1 local_a60 [16];
  undefined1 auStack_a50 [16];
  undefined4 local_a40;
  undefined4 local_a3c;
  undefined4 local_a38;
  undefined4 local_a34;
  undefined4 local_a30;
  undefined4 local_a2c;
  undefined4 local_a28;
  undefined4 local_a24;
  undefined1 local_a20 [16];
  undefined1 auStack_a10 [16];
  undefined4 local_a00;
  undefined4 local_9fc;
  undefined4 local_9f8;
  undefined4 local_9f4;
  undefined4 local_9f0;
  undefined4 local_9ec;
  undefined4 local_9e8;
  undefined4 local_9e4;
  undefined1 local_9e0 [16];
  undefined1 auStack_9d0 [16];
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined4 local_9a4;
  undefined1 local_9a0 [16];
  undefined1 auStack_990 [16];
  undefined4 local_980;
  undefined4 local_97c;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined4 local_964;
  undefined1 local_960 [16];
  undefined1 auStack_950 [16];
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined4 local_928;
  undefined4 local_924;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined4 local_900;
  undefined4 local_8fc;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined4 local_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined4 local_840;
  undefined4 local_83c;
  undefined4 local_838;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 local_82c;
  undefined4 local_828;
  undefined4 local_824;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined4 local_800;
  undefined4 local_7fc;
  undefined4 local_7f8;
  undefined4 local_7f4;
  undefined4 local_7f0;
  undefined4 local_7ec;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float local_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 *local_520;
  undefined1 *local_518;
  float *local_510;
  undefined8 *local_508;
  undefined1 *local_500;
  float *local_4f8;
  undefined8 *local_4f0;
  undefined1 *local_4e8;
  float *local_4e0;
  undefined8 *local_4d8;
  undefined1 *local_4d0;
  float *local_4c8;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  float *local_4b0;
  undefined8 *local_4a8;
  undefined1 *local_4a0;
  float *local_498;
  undefined8 *local_490;
  undefined1 *local_488;
  float *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  float *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 local_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_34;
  
  local_17b0 = *(int *)((long)in_RDI + 0x2c);
  local_17b4 = (int)in_RDI[6];
  local_17b8 = *(int *)((long)in_RDI + 0x34);
  local_17bc = (int)in_RDI[7];
  local_17c0 = (int)in_RDI[3];
  local_17c4 = local_17b0 * local_17b4 * local_17b8 * local_17c0;
  local_17a0 = in_RDI;
  for (local_17c8 = 0; local_17c8 < local_17bc; local_17c8 = local_17c8 + 1) {
    local_1788 = &local_1818;
    local_16dc = *(int *)((long)local_17a0 + 0x2c);
    local_16e0 = (int)local_17a0[6];
    local_16e4 = *(undefined4 *)((long)local_17a0 + 0x34);
    local_16f0 = (undefined1 (*) [32])
                 (*local_17a0 + local_17a0[8] * (long)local_17c8 * local_17a0[2]);
    local_16f8 = local_17a0[2];
    local_16fc = (undefined4)local_17a0[3];
    local_1708 = local_17a0[4];
    local_16d8 = &local_1818;
    local_16c8 = (long)local_16dc * (long)local_16e0 * local_16f8;
    local_1780 = &local_1818;
    local_1770 = &local_1818;
    local_16cc = 0x10;
    local_1794 = local_17c8;
    local_1795 = 1;
    local_1818 = 0;
    local_1808 = 0;
    local_1800 = 0;
    local_17f0 = 0;
    local_17ec = 0;
    local_17e8 = 0;
    local_17e4 = 0;
    local_17e0 = 0;
    local_17d8 = 0;
    local_1810 = 0;
    local_17d0 = local_16f0;
    for (local_181c = 0; local_181c + 7 < local_17c4; local_181c = local_181c + 8) {
      local_1768 = local_17d0;
      auVar10 = *local_17d0;
      local_1688 = local_17a9;
      local_1690 = local_1840;
      local_1840._0_8_ = auVar10._0_8_;
      local_1300 = local_1840._0_8_;
      local_1840._8_8_ = auVar10._8_8_;
      uStack_12f8 = local_1840._8_8_;
      local_1840._16_8_ = auVar10._16_8_;
      uStack_12f0 = local_1840._16_8_;
      local_1840._24_8_ = auVar10._24_8_;
      uStack_12e8 = local_1840._24_8_;
      local_b64 = 0x80000000;
      local_b00 = 0x80000000;
      auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
      local_b20 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
      auStack_b10 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
      local_1320 = local_b20._0_8_;
      uStack_1318 = local_b20._8_8_;
      uStack_1310 = auStack_b10._0_8_;
      uStack_1308 = auStack_b10._8_8_;
      local_b68 = 0x3f800000;
      local_ac0 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_ae0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_ad0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_1340 = local_ae0._0_8_;
      uStack_1338 = local_ae0._8_8_;
      uStack_1330 = auStack_ad0._0_8_;
      uStack_1328 = auStack_ad0._8_8_;
      local_b6c = 0xbf800000;
      local_a80 = 0xbf800000;
      auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
      local_aa0 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
      auStack_a90 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
      local_1360 = local_aa0._0_8_;
      uStack_1358 = local_aa0._8_8_;
      uStack_1350 = auStack_a90._0_8_;
      uStack_1348 = auStack_a90._8_8_;
      local_b70 = 0x3fc90fdb;
      local_a40 = 0x3fc90fdb;
      auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
      local_a60 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
      auStack_a50 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
      local_1380 = local_a60._0_8_;
      uStack_1378 = local_a60._8_8_;
      uStack_1370 = auStack_a50._0_8_;
      uStack_1368 = auStack_a50._8_8_;
      local_b74 = 0x3f800000;
      local_a00 = 0x3f800000;
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      local_a20 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auStack_a10 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      local_13a0 = local_a20._0_8_;
      uStack_1398 = local_a20._8_8_;
      uStack_1390 = auStack_a10._0_8_;
      uStack_1388 = auStack_a10._8_8_;
      local_b78 = 0xbeaaaa53;
      local_9c0 = 0xbeaaaa53;
      auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
      local_9e0 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
      auStack_9d0 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
      local_13c0 = local_9e0._0_8_;
      uStack_13b8 = local_9e0._8_8_;
      uStack_13b0 = auStack_9d0._0_8_;
      uStack_13a8 = auStack_9d0._8_8_;
      local_b7c = 0x3e4cb974;
      local_980 = 0x3e4cb974;
      auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
      local_9a0 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
      auStack_990 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
      local_13e0 = local_9a0._0_8_;
      uStack_13d8 = local_9a0._8_8_;
      uStack_13d0 = auStack_990._0_8_;
      uStack_13c8 = auStack_990._8_8_;
      local_b80 = 0xbe117200;
      local_940 = 0xbe117200;
      auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
      local_960 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
      auStack_950 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
      local_1400 = local_960._0_8_;
      uStack_13f8 = local_960._8_8_;
      uStack_13f0 = auStack_950._0_8_;
      uStack_13e8 = auStack_950._8_8_;
      local_b84 = 0x3dd9ed24;
      local_900 = 0x3dd9ed24;
      auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
      local_920 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
      auStack_910 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
      local_1420 = local_920._0_8_;
      uStack_1418 = local_920._8_8_;
      uStack_1410 = auStack_910._0_8_;
      uStack_1408 = auStack_910._8_8_;
      local_b88 = 0xbd99b01e;
      local_8c0 = 0xbd99b01e;
      auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
      local_8e0 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
      auStack_8d0 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
      local_1440 = local_8e0._0_8_;
      uStack_1438 = local_8e0._8_8_;
      uStack_1430 = auStack_8d0._0_8_;
      uStack_1428 = auStack_8d0._8_8_;
      local_b8c = 0x3d2edd4e;
      local_880 = 0x3d2edd4e;
      auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
      local_8a0 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
      auStack_890 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
      local_1460 = local_8a0._0_8_;
      uStack_1458 = local_8a0._8_8_;
      uStack_1450 = auStack_890._0_8_;
      uStack_1448 = auStack_890._8_8_;
      local_b90 = 0xbc83a25c;
      local_840 = 0xbc83a25c;
      auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
      local_860 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
      auStack_850 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
      local_1480 = local_860._0_8_;
      uStack_1478 = local_860._8_8_;
      uStack_1470 = auStack_850._0_8_;
      uStack_1468 = auStack_850._8_8_;
      local_b94 = 0x3b3ac537;
      local_800 = 0x3b3ac537;
      auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
      local_820 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
      auStack_810 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
      local_14a0 = local_820._0_8_;
      uStack_1498 = local_820._8_8_;
      uStack_1490 = auStack_810._0_8_;
      uStack_1488 = auStack_810._8_8_;
      local_1200 = local_b20._0_8_;
      uStack_11f8 = local_b20._8_8_;
      uStack_11f0 = auStack_b10._0_8_;
      uStack_11e8 = auStack_b10._8_8_;
      auVar12._16_8_ = auStack_b10._0_8_;
      auVar12._0_16_ = local_b20;
      auVar12._24_8_ = auStack_b10._8_8_;
      local_14c0 = vandps_avx(auVar12,auVar10);
      local_bc0 = local_b20._0_8_;
      uStack_bb8 = local_b20._8_8_;
      uStack_bb0 = auStack_b10._0_8_;
      uStack_ba8 = auStack_b10._8_8_;
      auVar15._16_8_ = auStack_b10._0_8_;
      auVar15._0_16_ = local_b20;
      auVar15._24_8_ = auStack_b10._8_8_;
      auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      local_14e0 = vandnps_avx(auVar15,auVar10);
      auVar10._16_8_ = auStack_ad0._0_8_;
      auVar10._0_16_ = local_ae0;
      auVar10._24_8_ = auStack_ad0._8_8_;
      local_1500 = vcmpps_avx(auVar10,local_14e0,1);
      local_1240 = local_1500._0_8_;
      uStack_1238 = local_1500._8_8_;
      uStack_1230 = local_1500._16_8_;
      uStack_1228 = local_1500._24_8_;
      local_1260 = local_aa0._0_8_;
      uStack_1258 = local_aa0._8_8_;
      uStack_1250 = auStack_a90._0_8_;
      uStack_1248 = auStack_a90._8_8_;
      auVar11._16_8_ = auStack_a90._0_8_;
      auVar11._0_16_ = local_aa0;
      auVar11._24_8_ = auStack_a90._8_8_;
      local_c80 = vandps_avx(local_1500,auVar11);
      local_c00 = local_1500._0_8_;
      uStack_bf8 = local_1500._8_8_;
      uStack_bf0 = local_1500._16_8_;
      uStack_be8 = local_1500._24_8_;
      local_c20 = local_14e0._0_8_;
      uStack_c18 = local_14e0._8_8_;
      uStack_c10 = local_14e0._16_8_;
      uStack_c08 = local_14e0._24_8_;
      local_ca0 = vandnps_avx(local_1500,local_14e0);
      local_b40 = vorps_avx(local_c80,local_ca0);
      local_1280 = local_1500._0_8_;
      uStack_1278 = local_1500._8_8_;
      uStack_1270 = local_1500._16_8_;
      uStack_1268 = local_1500._24_8_;
      local_12a0 = local_14e0._0_8_;
      uStack_1298 = local_14e0._8_8_;
      uStack_1290 = local_14e0._16_8_;
      uStack_1288 = local_14e0._24_8_;
      local_cc0 = vandps_avx(local_1500,local_14e0);
      local_c60 = local_ae0._0_8_;
      uStack_c58 = local_ae0._8_8_;
      uStack_c50 = auStack_ad0._0_8_;
      uStack_c48 = auStack_ad0._8_8_;
      local_c40._0_4_ = local_1500._0_4_;
      local_c40._4_4_ = local_1500._4_4_;
      local_c40._8_4_ = local_1500._8_4_;
      local_c40._12_4_ = local_1500._12_4_;
      local_c40._16_4_ = local_1500._16_4_;
      local_c40._20_4_ = local_1500._20_4_;
      local_c40._24_4_ = local_1500._24_4_;
      local_c40._28_4_ = local_1500._28_4_;
      auVar50._0_4_ = local_c40._0_4_ ^ auVar1._0_4_;
      auVar50._4_4_ = local_c40._4_4_ ^ auVar1._4_4_;
      auVar50._8_4_ = local_c40._8_4_ ^ auVar1._8_4_;
      auVar50._12_4_ = local_c40._12_4_ ^ auVar1._12_4_;
      auVar50._16_4_ = local_c40._16_4_ ^ auVar1._16_4_;
      auVar50._20_4_ = local_c40._20_4_ ^ auVar1._20_4_;
      auVar50._24_4_ = local_c40._24_4_ ^ auVar1._24_4_;
      auVar50._28_4_ = local_c40._28_4_ ^ auVar1._28_4_;
      auVar14._16_8_ = auStack_ad0._0_8_;
      auVar14._0_16_ = local_ae0;
      auVar14._24_8_ = auStack_ad0._8_8_;
      in_ZMM3 = ZEXT3264(auVar14);
      local_ce0 = vandps_avx(auVar50,auVar14);
      local_b60 = vorps_avx(local_cc0,local_ce0);
      local_1520 = vdivps_avx(local_b40,local_b60);
      local_1160 = local_1520._0_8_;
      uStack_1158 = local_1520._8_8_;
      uStack_1150 = local_1520._16_8_;
      uStack_1148 = local_1520._24_8_;
      local_1140._0_4_ = local_1520._0_4_;
      local_1140._4_4_ = local_1520._4_4_;
      uStack_1138._0_4_ = local_1520._8_4_;
      uStack_1138._4_4_ = local_1520._12_4_;
      uStack_1130._0_4_ = local_1520._16_4_;
      uStack_1130._4_4_ = local_1520._20_4_;
      uStack_1128._0_4_ = local_1520._24_4_;
      uStack_1128._4_4_ = local_1520._28_4_;
      uStack_1524 = uStack_1128._4_4_;
      local_1540 = (float)local_1140 * (float)local_1140;
      fStack_153c = local_1140._4_4_ * local_1140._4_4_;
      fStack_1538 = (float)uStack_1138 * (float)uStack_1138;
      fStack_1534 = uStack_1138._4_4_ * uStack_1138._4_4_;
      fStack_1530 = (float)uStack_1130 * (float)uStack_1130;
      fStack_152c = uStack_1130._4_4_ * uStack_1130._4_4_;
      fStack_1528 = (float)uStack_1128 * (float)uStack_1128;
      local_1180 = CONCAT44(fStack_153c,local_1540);
      uStack_1178 = CONCAT44(fStack_1534,fStack_1538);
      uStack_1170 = CONCAT44(fStack_152c,fStack_1530);
      uStack_1168 = CONCAT44(uStack_1128._4_4_,fStack_1528);
      local_11a0 = CONCAT44(fStack_153c,local_1540);
      uStack_1198 = CONCAT44(fStack_1534,fStack_1538);
      uStack_1190 = CONCAT44(fStack_152c,fStack_1530);
      uStack_1188 = CONCAT44(uStack_1128._4_4_,fStack_1528);
      uStack_1544 = uStack_1128._4_4_;
      local_1560 = local_1540 * local_1540;
      fStack_155c = fStack_153c * fStack_153c;
      fStack_1558 = fStack_1538 * fStack_1538;
      fStack_1554 = fStack_1534 * fStack_1534;
      fStack_1550 = fStack_1530 * fStack_1530;
      fStack_154c = fStack_152c * fStack_152c;
      fStack_1548 = fStack_1528 * fStack_1528;
      local_1068 = &local_1560;
      local_1070 = &local_1480;
      local_1078 = &local_1440;
      local_fe0 = CONCAT44(fStack_155c,local_1560);
      uStack_fd8 = CONCAT44(fStack_1554,fStack_1558);
      uStack_fd0 = CONCAT44(fStack_154c,fStack_1550);
      uStack_fc8 = CONCAT44(uStack_1128._4_4_,fStack_1548);
      auVar16._4_4_ = fStack_155c;
      auVar16._0_4_ = local_1560;
      auVar16._8_4_ = fStack_1558;
      auVar16._12_4_ = fStack_1554;
      auVar16._16_4_ = fStack_1550;
      auVar16._20_4_ = fStack_154c;
      auVar16._24_4_ = fStack_1548;
      auVar16._28_4_ = uStack_1128._4_4_;
      local_1000 = local_860._0_8_;
      uStack_ff8 = local_860._8_8_;
      uStack_ff0 = auStack_850._0_8_;
      uStack_fe8 = auStack_850._8_8_;
      auVar25._16_8_ = auStack_850._0_8_;
      auVar25._0_16_ = local_860;
      auVar25._24_8_ = auStack_850._8_8_;
      local_1020 = local_8e0._0_8_;
      uStack_1018 = local_8e0._8_8_;
      uStack_1010 = auStack_8d0._0_8_;
      uStack_1008 = auStack_8d0._8_8_;
      auVar27._16_8_ = auStack_8d0._0_8_;
      auVar27._0_16_ = local_8e0;
      auVar27._24_8_ = auStack_8d0._8_8_;
      auVar2 = vfmadd213ps_fma(auVar25,auVar16,auVar27);
      local_1080 = &local_1560;
      local_1088 = local_15e0;
      local_1090 = &local_1400;
      local_f80 = CONCAT44(fStack_155c,local_1560);
      uStack_f78 = CONCAT44(fStack_1554,fStack_1558);
      uStack_f70 = CONCAT44(fStack_154c,fStack_1550);
      uStack_f68 = CONCAT44(uStack_1128._4_4_,fStack_1548);
      auVar17._4_4_ = fStack_155c;
      auVar17._0_4_ = local_1560;
      auVar17._8_4_ = fStack_1558;
      auVar17._12_4_ = fStack_1554;
      auVar17._16_4_ = fStack_1550;
      auVar17._20_4_ = fStack_154c;
      auVar17._24_4_ = fStack_1548;
      auVar17._28_4_ = uStack_1128._4_4_;
      local_15e0._0_8_ = auVar2._0_8_;
      local_fa0 = local_15e0._0_8_;
      local_15e0._8_8_ = auVar2._8_8_;
      uStack_f98 = local_15e0._8_8_;
      uStack_f90 = 0;
      uStack_f88 = 0;
      local_fc0 = local_960._0_8_;
      uStack_fb8 = local_960._8_8_;
      uStack_fb0 = auStack_950._0_8_;
      uStack_fa8 = auStack_950._8_8_;
      auVar29._16_8_ = auStack_950._0_8_;
      auVar29._0_16_ = local_960;
      auVar29._24_8_ = auStack_950._8_8_;
      auVar3 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar17,auVar29);
      local_1098 = &local_1560;
      local_10a0 = local_15c0;
      local_10a8 = &local_13c0;
      local_f20 = CONCAT44(fStack_155c,local_1560);
      uStack_f18 = CONCAT44(fStack_1554,fStack_1558);
      uStack_f10 = CONCAT44(fStack_154c,fStack_1550);
      uStack_f08 = CONCAT44(uStack_1128._4_4_,fStack_1548);
      auVar18._4_4_ = fStack_155c;
      auVar18._0_4_ = local_1560;
      auVar18._8_4_ = fStack_1558;
      auVar18._12_4_ = fStack_1554;
      auVar18._16_4_ = fStack_1550;
      auVar18._20_4_ = fStack_154c;
      auVar18._24_4_ = fStack_1548;
      auVar18._28_4_ = uStack_1128._4_4_;
      local_15c0._0_8_ = auVar3._0_8_;
      local_f40 = local_15c0._0_8_;
      local_15c0._8_8_ = auVar3._8_8_;
      uStack_f38 = local_15c0._8_8_;
      uStack_f30 = 0;
      uStack_f28 = 0;
      local_f60 = local_9e0._0_8_;
      uStack_f58 = local_9e0._8_8_;
      uStack_f50 = auStack_9d0._0_8_;
      uStack_f48 = auStack_9d0._8_8_;
      auVar31._16_8_ = auStack_9d0._0_8_;
      auVar31._0_16_ = local_9e0;
      auVar31._24_8_ = auStack_9d0._8_8_;
      auVar4 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar18,auVar31);
      local_10b0 = &local_1560;
      local_10b8 = &local_14a0;
      local_10c0 = &local_1460;
      local_ec0 = CONCAT44(fStack_155c,local_1560);
      uStack_eb8 = CONCAT44(fStack_1554,fStack_1558);
      uStack_eb0 = CONCAT44(fStack_154c,fStack_1550);
      uStack_ea8 = CONCAT44(uStack_1128._4_4_,fStack_1548);
      auVar19._4_4_ = fStack_155c;
      auVar19._0_4_ = local_1560;
      auVar19._8_4_ = fStack_1558;
      auVar19._12_4_ = fStack_1554;
      auVar19._16_4_ = fStack_1550;
      auVar19._20_4_ = fStack_154c;
      auVar19._24_4_ = fStack_1548;
      auVar19._28_4_ = uStack_1128._4_4_;
      local_ee0 = local_820._0_8_;
      uStack_ed8 = local_820._8_8_;
      uStack_ed0 = auStack_810._0_8_;
      uStack_ec8 = auStack_810._8_8_;
      auVar24._16_8_ = auStack_810._0_8_;
      auVar24._0_16_ = local_820;
      auVar24._24_8_ = auStack_810._8_8_;
      local_f00 = local_8a0._0_8_;
      uStack_ef8 = local_8a0._8_8_;
      uStack_ef0 = auStack_890._0_8_;
      uStack_ee8 = auStack_890._8_8_;
      auVar26._16_8_ = auStack_890._0_8_;
      auVar26._0_16_ = local_8a0;
      auVar26._24_8_ = auStack_890._8_8_;
      auVar5 = vfmadd213ps_fma(auVar24,auVar19,auVar26);
      local_10c8 = &local_1560;
      local_10d0 = local_1660;
      local_10d8 = &local_1420;
      local_e60 = CONCAT44(fStack_155c,local_1560);
      uStack_e58 = CONCAT44(fStack_1554,fStack_1558);
      uStack_e50 = CONCAT44(fStack_154c,fStack_1550);
      uStack_e48 = CONCAT44(uStack_1128._4_4_,fStack_1548);
      auVar20._4_4_ = fStack_155c;
      auVar20._0_4_ = local_1560;
      auVar20._8_4_ = fStack_1558;
      auVar20._12_4_ = fStack_1554;
      auVar20._16_4_ = fStack_1550;
      auVar20._20_4_ = fStack_154c;
      auVar20._24_4_ = fStack_1548;
      auVar20._28_4_ = uStack_1128._4_4_;
      local_1660._0_8_ = auVar5._0_8_;
      local_e80 = local_1660._0_8_;
      local_1660._8_8_ = auVar5._8_8_;
      uStack_e78 = local_1660._8_8_;
      uStack_e70 = 0;
      uStack_e68 = 0;
      local_ea0 = local_920._0_8_;
      uStack_e98 = local_920._8_8_;
      uStack_e90 = auStack_910._0_8_;
      uStack_e88 = auStack_910._8_8_;
      auVar28._16_8_ = auStack_910._0_8_;
      auVar28._0_16_ = local_920;
      auVar28._24_8_ = auStack_910._8_8_;
      auVar6 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar20,auVar28);
      local_10e0 = &local_1560;
      local_10e8 = local_1640;
      local_10f0 = &local_13e0;
      local_e00 = CONCAT44(fStack_155c,local_1560);
      uStack_df8 = CONCAT44(fStack_1554,fStack_1558);
      uStack_df0 = CONCAT44(fStack_154c,fStack_1550);
      uStack_de8 = CONCAT44(uStack_1128._4_4_,fStack_1548);
      auVar21._4_4_ = fStack_155c;
      auVar21._0_4_ = local_1560;
      auVar21._8_4_ = fStack_1558;
      auVar21._12_4_ = fStack_1554;
      auVar21._16_4_ = fStack_1550;
      auVar21._20_4_ = fStack_154c;
      auVar21._24_4_ = fStack_1548;
      auVar21._28_4_ = uStack_1128._4_4_;
      local_1640._0_8_ = auVar6._0_8_;
      local_e20 = local_1640._0_8_;
      local_1640._8_8_ = auVar6._8_8_;
      uStack_e18 = local_1640._8_8_;
      uStack_e10 = 0;
      uStack_e08 = 0;
      local_e40 = local_9a0._0_8_;
      uStack_e38 = local_9a0._8_8_;
      uStack_e30 = auStack_990._0_8_;
      uStack_e28 = auStack_990._8_8_;
      auVar30._16_8_ = auStack_990._0_8_;
      auVar30._0_16_ = local_9a0;
      auVar30._24_8_ = auStack_990._8_8_;
      auVar7 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar21,auVar30);
      local_10f8 = &local_1560;
      local_1100 = local_1620;
      local_1108 = &local_13a0;
      local_da0 = CONCAT44(fStack_155c,local_1560);
      uStack_d98 = CONCAT44(fStack_1554,fStack_1558);
      uStack_d90 = CONCAT44(fStack_154c,fStack_1550);
      uStack_d88 = CONCAT44(uStack_1128._4_4_,fStack_1548);
      auVar22._4_4_ = fStack_155c;
      auVar22._0_4_ = local_1560;
      auVar22._8_4_ = fStack_1558;
      auVar22._12_4_ = fStack_1554;
      auVar22._16_4_ = fStack_1550;
      auVar22._20_4_ = fStack_154c;
      auVar22._24_4_ = fStack_1548;
      auVar22._28_4_ = uStack_1128._4_4_;
      local_1620._0_8_ = auVar7._0_8_;
      local_dc0 = local_1620._0_8_;
      local_1620._8_8_ = auVar7._8_8_;
      uStack_db8 = local_1620._8_8_;
      uStack_db0 = 0;
      uStack_da8 = 0;
      local_de0 = local_a20._0_8_;
      uStack_dd8 = local_a20._8_8_;
      uStack_dd0 = auStack_a10._0_8_;
      uStack_dc8 = auStack_a10._8_8_;
      auVar32._16_8_ = auStack_a10._0_8_;
      auVar32._0_16_ = local_a20;
      auVar32._24_8_ = auStack_a10._8_8_;
      auVar8 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar22,auVar32);
      local_1110 = &local_1540;
      local_1118 = local_15a0;
      local_1120 = local_1600;
      local_d40 = CONCAT44(fStack_153c,local_1540);
      uStack_d38 = CONCAT44(fStack_1534,fStack_1538);
      uStack_d30 = CONCAT44(fStack_152c,fStack_1530);
      uStack_d28 = CONCAT44(uStack_1128._4_4_,fStack_1528);
      auVar23._4_4_ = fStack_153c;
      auVar23._0_4_ = local_1540;
      auVar23._8_4_ = fStack_1538;
      auVar23._12_4_ = fStack_1534;
      auVar23._16_4_ = fStack_1530;
      auVar23._20_4_ = fStack_152c;
      auVar23._24_4_ = fStack_1528;
      auVar23._28_4_ = uStack_1128._4_4_;
      local_15a0._0_8_ = auVar4._0_8_;
      local_d60 = local_15a0._0_8_;
      local_15a0._8_8_ = auVar4._8_8_;
      uStack_d58 = local_15a0._8_8_;
      uStack_d50 = 0;
      uStack_d48 = 0;
      local_1600._0_8_ = auVar8._0_8_;
      local_d80 = local_1600._0_8_;
      local_1600._8_8_ = auVar8._8_8_;
      uStack_d78 = local_1600._8_8_;
      uStack_d70 = 0;
      uStack_d68 = 0;
      auVar9 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar23,ZEXT1632(auVar8));
      local_1580._0_4_ = auVar9._0_4_;
      local_11c0 = (float)local_1580._0_4_;
      local_1580._4_4_ = auVar9._4_4_;
      fStack_11bc = (float)local_1580._4_4_;
      fStack_1578 = auVar9._8_4_;
      fStack_11b8 = fStack_1578;
      fStack_1574 = auVar9._12_4_;
      fStack_11b4 = fStack_1574;
      uStack_11b0 = 0;
      uStack_11ac = 0;
      uStack_11a8 = 0;
      uStack_11a4 = 0;
      local_11e0 = local_1520._0_8_;
      uStack_11d8 = local_1520._8_8_;
      uStack_11d0 = local_1520._16_8_;
      uStack_11c8 = local_1520._24_8_;
      local_1040 = (float)local_1580._0_4_ * (float)local_1140;
      fStack_103c = (float)local_1580._4_4_ * local_1140._4_4_;
      fStack_1038 = fStack_1578 * (float)uStack_1138;
      fStack_1034 = fStack_1574 * uStack_1138._4_4_;
      fStack_1030 = (float)uStack_1130 * 0.0;
      fStack_102c = uStack_1130._4_4_ * 0.0;
      fStack_1028 = (float)uStack_1128 * 0.0;
      local_12c0 = local_1500._0_8_;
      uStack_12b8 = local_1500._8_8_;
      uStack_12b0 = local_1500._16_8_;
      uStack_12a8 = local_1500._24_8_;
      local_12e0 = local_a60._0_8_;
      uStack_12d8 = local_a60._8_8_;
      uStack_12d0 = auStack_a50._0_8_;
      uStack_12c8 = auStack_a50._8_8_;
      auVar1._16_8_ = auStack_a50._0_8_;
      auVar1._0_16_ = local_a60;
      auVar1._24_8_ = auStack_a50._8_8_;
      _local_1060 = vandps_avx(local_1500,auVar1);
      local_d00 = local_1040 + (float)local_1060._0_4_;
      fStack_cfc = fStack_103c + (float)local_1060._4_4_;
      fStack_cf8 = fStack_1038 + fStack_1058;
      fStack_cf4 = fStack_1034 + fStack_1054;
      fStack_cf0 = fStack_1030 + fStack_1050;
      fStack_cec = fStack_102c + fStack_104c;
      fStack_ce8 = fStack_1028 + fStack_1048;
      fStack_ce4 = fStack_1044 + 0.0;
      local_d20 = local_14c0._0_8_;
      uStack_d18 = local_14c0._8_8_;
      uStack_d10 = local_14c0._16_8_;
      uStack_d08 = local_14c0._24_8_;
      auVar13._4_4_ = fStack_cfc;
      auVar13._0_4_ = local_d00;
      auVar13._8_4_ = fStack_cf8;
      auVar13._12_4_ = fStack_cf4;
      auVar13._16_4_ = fStack_cf0;
      auVar13._20_4_ = fStack_cec;
      auVar13._24_4_ = fStack_ce8;
      auVar13._28_4_ = fStack_ce4;
      local_1840 = vorps_avx(auVar13,local_14c0);
      local_1730 = local_17d0;
      local_1760 = local_1840._0_8_;
      uStack_1758 = local_1840._8_8_;
      uStack_1750 = local_1840._16_8_;
      uStack_1748 = local_1840._24_8_;
      *local_17d0 = local_1840;
      local_17d0 = local_17d0 + 1;
      local_1660 = ZEXT1632(auVar5);
      local_1640 = ZEXT1632(auVar6);
      local_1620 = ZEXT1632(auVar7);
      local_1600 = ZEXT1632(auVar8);
      local_15e0 = ZEXT1632(auVar2);
      local_15c0 = ZEXT1632(auVar3);
      local_15a0 = ZEXT1632(auVar4);
      _local_1580 = ZEXT1632(auVar9);
      local_1220 = local_1300;
      uStack_1218 = uStack_12f8;
      uStack_1210 = uStack_12f0;
      uStack_1208 = uStack_12e8;
      local_1140 = local_1520._0_8_;
      uStack_1138 = local_1520._8_8_;
      uStack_1130 = local_1520._16_8_;
      uStack_1128 = local_1520._24_8_;
      uStack_1024 = uStack_11a4;
      local_c40 = local_1500;
      local_be0 = local_1300;
      uStack_bd8 = uStack_12f8;
      uStack_bd0 = uStack_12f0;
      uStack_bc8 = uStack_12e8;
      local_afc = local_b00;
      local_af8 = local_b00;
      local_af4 = local_b00;
      local_af0 = local_b00;
      local_aec = local_b00;
      local_ae8 = local_b00;
      local_ae4 = local_b00;
      local_abc = local_ac0;
      local_ab8 = local_ac0;
      local_ab4 = local_ac0;
      local_ab0 = local_ac0;
      local_aac = local_ac0;
      local_aa8 = local_ac0;
      local_aa4 = local_ac0;
      local_a7c = local_a80;
      local_a78 = local_a80;
      local_a74 = local_a80;
      local_a70 = local_a80;
      local_a6c = local_a80;
      local_a68 = local_a80;
      local_a64 = local_a80;
      local_a3c = local_a40;
      local_a38 = local_a40;
      local_a34 = local_a40;
      local_a30 = local_a40;
      local_a2c = local_a40;
      local_a28 = local_a40;
      local_a24 = local_a40;
      local_9fc = local_a00;
      local_9f8 = local_a00;
      local_9f4 = local_a00;
      local_9f0 = local_a00;
      local_9ec = local_a00;
      local_9e8 = local_a00;
      local_9e4 = local_a00;
      local_9bc = local_9c0;
      local_9b8 = local_9c0;
      local_9b4 = local_9c0;
      local_9b0 = local_9c0;
      local_9ac = local_9c0;
      local_9a8 = local_9c0;
      local_9a4 = local_9c0;
      local_97c = local_980;
      local_978 = local_980;
      local_974 = local_980;
      local_970 = local_980;
      local_96c = local_980;
      local_968 = local_980;
      local_964 = local_980;
      local_93c = local_940;
      local_938 = local_940;
      local_934 = local_940;
      local_930 = local_940;
      local_92c = local_940;
      local_928 = local_940;
      local_924 = local_940;
      local_8fc = local_900;
      local_8f8 = local_900;
      local_8f4 = local_900;
      local_8f0 = local_900;
      local_8ec = local_900;
      local_8e8 = local_900;
      local_8e4 = local_900;
      local_8bc = local_8c0;
      local_8b8 = local_8c0;
      local_8b4 = local_8c0;
      local_8b0 = local_8c0;
      local_8ac = local_8c0;
      local_8a8 = local_8c0;
      local_8a4 = local_8c0;
      local_87c = local_880;
      local_878 = local_880;
      local_874 = local_880;
      local_870 = local_880;
      local_86c = local_880;
      local_868 = local_880;
      local_864 = local_880;
      local_83c = local_840;
      local_838 = local_840;
      local_834 = local_840;
      local_830 = local_840;
      local_82c = local_840;
      local_828 = local_840;
      local_824 = local_840;
      local_7fc = local_800;
      local_7f8 = local_800;
      local_7f4 = local_800;
      local_7f0 = local_800;
      local_7ec = local_800;
      local_7e8 = local_800;
      local_7e4 = local_800;
    }
    for (; local_16b8 = local_1770, local_17f8 = local_1708, local_181c + 3 < local_17c4;
        local_181c = local_181c + 4) {
      local_1728 = local_17d0;
      auVar3 = *(undefined1 (*) [16])*local_17d0;
      local_1678 = local_17a9;
      local_1680 = local_1850;
      local_1850._0_8_ = auVar3._0_8_;
      local_630 = local_1850._0_8_;
      local_1850._8_8_ = auVar3._8_8_;
      uStack_628 = local_1850._8_8_;
      local_54 = 0x80000000;
      local_34 = 0x80000000;
      local_50 = 0x80000000;
      local_640 = 0x8000000080000000;
      uStack_638 = 0x8000000080000000;
      local_74 = 0x3f800000;
      local_58 = 0x3f800000;
      local_70 = 0x3f800000;
      local_650 = 0x3f8000003f800000;
      uStack_648 = 0x3f8000003f800000;
      local_94 = 0xbf800000;
      local_78 = 0xbf800000;
      local_90 = 0xbf800000;
      local_660 = 0xbf800000bf800000;
      uStack_658 = 0xbf800000bf800000;
      local_b4 = 0x3fc90fdb;
      local_98 = 0x3fc90fdb;
      local_b0 = 0x3fc90fdb;
      local_670 = 0x3fc90fdb3fc90fdb;
      uStack_668 = 0x3fc90fdb3fc90fdb;
      local_d4 = 0x3f800000;
      local_b8 = 0x3f800000;
      local_d0 = 0x3f800000;
      local_680 = 0x3f8000003f800000;
      uStack_678 = 0x3f8000003f800000;
      local_f4 = 0xbeaaaa53;
      local_d8 = 0xbeaaaa53;
      local_f0 = 0xbeaaaa53;
      local_690 = 0xbeaaaa53beaaaa53;
      uStack_688 = 0xbeaaaa53beaaaa53;
      local_114 = 0x3e4cb974;
      local_f8 = 0x3e4cb974;
      local_110 = 0x3e4cb974;
      local_6a0 = 0x3e4cb9743e4cb974;
      uStack_698 = 0x3e4cb9743e4cb974;
      local_134 = 0xbe117200;
      local_118 = 0xbe117200;
      local_130 = 0xbe117200;
      local_6b0 = 0xbe117200be117200;
      uStack_6a8 = 0xbe117200be117200;
      local_154 = 0x3dd9ed24;
      local_138 = 0x3dd9ed24;
      local_150 = 0x3dd9ed24;
      local_6c0 = 0x3dd9ed243dd9ed24;
      uStack_6b8 = 0x3dd9ed243dd9ed24;
      local_174 = 0xbd99b01e;
      local_158 = 0xbd99b01e;
      local_170 = 0xbd99b01e;
      local_6d0 = 0xbd99b01ebd99b01e;
      uStack_6c8 = 0xbd99b01ebd99b01e;
      local_194 = 0x3d2edd4e;
      local_178 = 0x3d2edd4e;
      local_190 = 0x3d2edd4e;
      local_6e0 = 0x3d2edd4e3d2edd4e;
      uStack_6d8 = 0x3d2edd4e3d2edd4e;
      local_1b4 = 0xbc83a25c;
      local_198 = 0xbc83a25c;
      local_1b0 = 0xbc83a25c;
      local_6f0 = 0xbc83a25cbc83a25c;
      uStack_6e8 = 0xbc83a25cbc83a25c;
      local_1d4 = 0x3b3ac537;
      local_1b8 = 0x3b3ac537;
      local_1d0 = 0x3b3ac537;
      local_700 = 0x3b3ac5373b3ac537;
      uStack_6f8 = 0x3b3ac5373b3ac537;
      auVar4._8_8_ = 0x8000000080000000;
      auVar4._0_8_ = 0x8000000080000000;
      local_710 = vpand_avx(auVar4,auVar3);
      auVar8._8_8_ = 0x8000000080000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar2 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
      local_720 = vpandn_avx(auVar8,auVar3);
      local_280 = local_720._0_8_;
      uStack_278 = local_720._8_8_;
      auVar6._8_8_ = 0x3f8000003f800000;
      auVar6._0_8_ = 0x3f8000003f800000;
      local_730 = vcmpps_avx(auVar6,local_720,1);
      local_5d0 = local_730._0_8_;
      uStack_5c8 = local_730._8_8_;
      auVar3._8_8_ = 0xbf800000bf800000;
      auVar3._0_8_ = 0xbf800000bf800000;
      local_290 = vpand_avx(local_730,auVar3);
      local_230 = local_730._0_8_;
      uStack_228 = local_730._8_8_;
      local_240 = local_720._0_8_;
      uStack_238 = local_720._8_8_;
      local_2a0 = vpandn_avx(local_730,local_720);
      local_1f0 = vpor_avx(local_290,local_2a0);
      local_5f0 = local_730._0_8_;
      uStack_5e8 = local_730._8_8_;
      local_600 = local_720._0_8_;
      uStack_5f8 = local_720._8_8_;
      local_2b0 = vpand_avx(local_730,local_720);
      auVar7._8_8_ = 0x3f8000003f800000;
      auVar7._0_8_ = 0x3f8000003f800000;
      in_ZMM3 = ZEXT1664(auVar7);
      local_2c0 = vpand_avx(local_730 ^ auVar2,auVar7);
      local_200 = vpor_avx(local_2b0,local_2c0);
      local_740 = vdivps_avx(local_1f0,local_200);
      local_560 = local_740._0_8_;
      uStack_558 = local_740._8_8_;
      local_550._0_4_ = local_740._0_4_;
      local_550._4_4_ = local_740._4_4_;
      uStack_548._0_4_ = local_740._8_4_;
      uStack_548._4_4_ = local_740._12_4_;
      local_750 = (float)local_550 * (float)local_550;
      fStack_74c = local_550._4_4_ * local_550._4_4_;
      fStack_748 = (float)uStack_548 * (float)uStack_548;
      fStack_744 = uStack_548._4_4_ * uStack_548._4_4_;
      local_570 = CONCAT44(fStack_74c,local_750);
      uStack_568 = CONCAT44(fStack_744,fStack_748);
      local_580 = CONCAT44(fStack_74c,local_750);
      uStack_578 = CONCAT44(fStack_744,fStack_748);
      local_760 = local_750 * local_750;
      fStack_75c = fStack_74c * fStack_74c;
      fStack_758 = fStack_748 * fStack_748;
      fStack_754 = fStack_744 * fStack_744;
      local_468 = &local_760;
      local_470 = &local_6f0;
      local_478 = &local_6d0;
      local_440 = CONCAT44(fStack_75c,local_760);
      uStack_438 = CONCAT44(fStack_754,fStack_758);
      auVar9._4_4_ = fStack_75c;
      auVar9._0_4_ = local_760;
      auVar9._8_4_ = fStack_758;
      auVar9._12_4_ = fStack_754;
      local_450 = 0xbc83a25cbc83a25c;
      uStack_448 = 0xbc83a25cbc83a25c;
      auVar41._8_8_ = 0xbc83a25cbc83a25c;
      auVar41._0_8_ = 0xbc83a25cbc83a25c;
      local_460 = 0xbd99b01ebd99b01e;
      uStack_458 = 0xbd99b01ebd99b01e;
      auVar43._8_8_ = 0xbd99b01ebd99b01e;
      auVar43._0_8_ = 0xbd99b01ebd99b01e;
      local_7a0 = vfmadd213ps_fma(auVar41,auVar9,auVar43);
      local_480 = &local_760;
      local_488 = local_7a0;
      local_490 = &local_6b0;
      local_410 = CONCAT44(fStack_75c,local_760);
      uStack_408 = CONCAT44(fStack_754,fStack_758);
      auVar33._4_4_ = fStack_75c;
      auVar33._0_4_ = local_760;
      auVar33._8_4_ = fStack_758;
      auVar33._12_4_ = fStack_754;
      local_420 = local_7a0._0_8_;
      uStack_418 = local_7a0._8_8_;
      local_430 = 0xbe117200be117200;
      uStack_428 = 0xbe117200be117200;
      auVar45._8_8_ = 0xbe117200be117200;
      auVar45._0_8_ = 0xbe117200be117200;
      local_790 = vfmadd213ps_fma(local_7a0,auVar33,auVar45);
      local_498 = &local_760;
      local_4a0 = local_790;
      local_4a8 = &local_690;
      local_3e0 = CONCAT44(fStack_75c,local_760);
      uStack_3d8 = CONCAT44(fStack_754,fStack_758);
      auVar34._4_4_ = fStack_75c;
      auVar34._0_4_ = local_760;
      auVar34._8_4_ = fStack_758;
      auVar34._12_4_ = fStack_754;
      local_3f0 = local_790._0_8_;
      uStack_3e8 = local_790._8_8_;
      local_400 = 0xbeaaaa53beaaaa53;
      uStack_3f8 = 0xbeaaaa53beaaaa53;
      auVar47._8_8_ = 0xbeaaaa53beaaaa53;
      auVar47._0_8_ = 0xbeaaaa53beaaaa53;
      local_780 = vfmadd213ps_fma(local_790,auVar34,auVar47);
      local_4b0 = &local_760;
      local_4b8 = &local_700;
      local_4c0 = &local_6e0;
      local_3b0 = CONCAT44(fStack_75c,local_760);
      uStack_3a8 = CONCAT44(fStack_754,fStack_758);
      auVar35._4_4_ = fStack_75c;
      auVar35._0_4_ = local_760;
      auVar35._8_4_ = fStack_758;
      auVar35._12_4_ = fStack_754;
      local_3c0 = 0x3b3ac5373b3ac537;
      uStack_3b8 = 0x3b3ac5373b3ac537;
      auVar40._8_8_ = 0x3b3ac5373b3ac537;
      auVar40._0_8_ = 0x3b3ac5373b3ac537;
      local_3d0 = 0x3d2edd4e3d2edd4e;
      uStack_3c8 = 0x3d2edd4e3d2edd4e;
      auVar42._8_8_ = 0x3d2edd4e3d2edd4e;
      auVar42._0_8_ = 0x3d2edd4e3d2edd4e;
      local_7e0 = vfmadd213ps_fma(auVar40,auVar35,auVar42);
      local_4c8 = &local_760;
      local_4d0 = local_7e0;
      local_4d8 = &local_6c0;
      local_380 = CONCAT44(fStack_75c,local_760);
      uStack_378 = CONCAT44(fStack_754,fStack_758);
      auVar36._4_4_ = fStack_75c;
      auVar36._0_4_ = local_760;
      auVar36._8_4_ = fStack_758;
      auVar36._12_4_ = fStack_754;
      local_390 = local_7e0._0_8_;
      uStack_388 = local_7e0._8_8_;
      local_3a0 = 0x3dd9ed243dd9ed24;
      uStack_398 = 0x3dd9ed243dd9ed24;
      auVar44._8_8_ = 0x3dd9ed243dd9ed24;
      auVar44._0_8_ = 0x3dd9ed243dd9ed24;
      local_7d0 = vfmadd213ps_fma(local_7e0,auVar36,auVar44);
      local_4e0 = &local_760;
      local_4e8 = local_7d0;
      local_4f0 = &local_6a0;
      local_350 = CONCAT44(fStack_75c,local_760);
      uStack_348 = CONCAT44(fStack_754,fStack_758);
      auVar37._4_4_ = fStack_75c;
      auVar37._0_4_ = local_760;
      auVar37._8_4_ = fStack_758;
      auVar37._12_4_ = fStack_754;
      local_360 = local_7d0._0_8_;
      uStack_358 = local_7d0._8_8_;
      local_370 = 0x3e4cb9743e4cb974;
      uStack_368 = 0x3e4cb9743e4cb974;
      auVar46._8_8_ = 0x3e4cb9743e4cb974;
      auVar46._0_8_ = 0x3e4cb9743e4cb974;
      local_7c0 = vfmadd213ps_fma(local_7d0,auVar37,auVar46);
      local_4f8 = &local_760;
      local_500 = local_7c0;
      local_508 = &local_680;
      local_320 = CONCAT44(fStack_75c,local_760);
      uStack_318 = CONCAT44(fStack_754,fStack_758);
      auVar38._4_4_ = fStack_75c;
      auVar38._0_4_ = local_760;
      auVar38._8_4_ = fStack_758;
      auVar38._12_4_ = fStack_754;
      local_330 = local_7c0._0_8_;
      uStack_328 = local_7c0._8_8_;
      local_340 = 0x3f8000003f800000;
      uStack_338 = 0x3f8000003f800000;
      auVar48._8_8_ = 0x3f8000003f800000;
      auVar48._0_8_ = 0x3f8000003f800000;
      local_7b0 = vfmadd213ps_fma(local_7c0,auVar38,auVar48);
      local_510 = &local_750;
      local_518 = local_780;
      local_520 = local_7b0;
      local_2f0 = CONCAT44(fStack_74c,local_750);
      uStack_2e8 = CONCAT44(fStack_744,fStack_748);
      auVar39._4_4_ = fStack_74c;
      auVar39._0_4_ = local_750;
      auVar39._8_4_ = fStack_748;
      auVar39._12_4_ = fStack_744;
      local_300 = local_780._0_8_;
      uStack_2f8 = local_780._8_8_;
      local_310 = local_7b0._0_8_;
      uStack_308 = local_7b0._8_8_;
      local_770 = vfmadd213ps_fma(local_780,auVar39,local_7b0);
      local_5a0 = local_740._0_8_;
      uStack_598 = local_740._8_8_;
      local_590._0_4_ = local_770._0_4_;
      local_590._4_4_ = local_770._4_4_;
      uStack_588._0_4_ = local_770._8_4_;
      uStack_588._4_4_ = local_770._12_4_;
      local_530 = (float)local_590 * (float)local_550;
      fStack_52c = local_590._4_4_ * local_550._4_4_;
      fStack_528 = (float)uStack_588 * (float)uStack_548;
      fStack_524 = uStack_588._4_4_ * uStack_548._4_4_;
      local_610 = local_730._0_8_;
      uStack_608 = local_730._8_8_;
      auVar2._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar2._0_8_ = 0x3fc90fdb3fc90fdb;
      _local_540 = vpand_avx(local_730,auVar2);
      local_2d0 = local_530 + (float)local_540._0_4_;
      fStack_2cc = fStack_52c + (float)local_540._4_4_;
      fStack_2c8 = fStack_528 + fStack_538;
      fStack_2c4 = fStack_524 + fStack_534;
      local_2e0 = local_710._0_8_;
      uStack_2d8 = local_710._8_8_;
      auVar5._4_4_ = fStack_2cc;
      auVar5._0_4_ = local_2d0;
      auVar5._8_4_ = fStack_2c8;
      auVar5._12_4_ = fStack_2c4;
      local_1850 = vpor_avx(auVar5,local_710);
      local_1710 = local_17d0;
      local_1720 = local_1850._0_8_;
      uStack_1718 = local_1850._8_8_;
      *(undefined1 (*) [16])*local_17d0 = local_1850;
      local_17d0 = (undefined1 (*) [32])(*local_17d0 + 0x10);
      local_620 = local_670;
      uStack_618 = uStack_668;
      local_5e0 = local_660;
      uStack_5d8 = uStack_658;
      local_5c0 = local_630;
      uStack_5b8 = uStack_628;
      local_5b0 = local_640;
      uStack_5a8 = uStack_638;
      local_590 = local_770._0_8_;
      uStack_588 = local_770._8_8_;
      local_550 = local_740._0_8_;
      uStack_548 = local_740._8_8_;
      local_270 = local_650;
      uStack_268 = uStack_648;
      local_260 = local_650;
      uStack_258 = uStack_648;
      local_250 = local_730;
      local_220 = local_630;
      uStack_218 = uStack_628;
      local_210 = local_640;
      uStack_208 = uStack_638;
      uStack_1cc = local_1d0;
      uStack_1c8 = local_1d0;
      uStack_1c4 = local_1d0;
      uStack_1ac = local_1b0;
      uStack_1a8 = local_1b0;
      uStack_1a4 = local_1b0;
      uStack_18c = local_190;
      uStack_188 = local_190;
      uStack_184 = local_190;
      uStack_16c = local_170;
      uStack_168 = local_170;
      uStack_164 = local_170;
      uStack_14c = local_150;
      uStack_148 = local_150;
      uStack_144 = local_150;
      uStack_12c = local_130;
      uStack_128 = local_130;
      uStack_124 = local_130;
      uStack_10c = local_110;
      uStack_108 = local_110;
      uStack_104 = local_110;
      uStack_ec = local_f0;
      uStack_e8 = local_f0;
      uStack_e4 = local_f0;
      uStack_cc = local_d0;
      uStack_c8 = local_d0;
      uStack_c4 = local_d0;
      uStack_ac = local_b0;
      uStack_a8 = local_b0;
      uStack_a4 = local_b0;
      uStack_8c = local_90;
      uStack_88 = local_90;
      uStack_84 = local_90;
      uStack_6c = local_70;
      uStack_68 = local_70;
      uStack_64 = local_70;
      uStack_4c = local_50;
      uStack_48 = local_50;
      uStack_44 = local_50;
    }
    for (; local_181c < local_17c4; local_181c = local_181c + 1) {
      local_1668 = local_17a9;
      local_1670 = local_17d0;
      in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
      fVar49 = atanf(*(float *)*local_17d0);
      *(float *)*local_17d0 = fVar49;
      local_17d0 = (undefined1 (*) [32])(*local_17d0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}